

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PokerCardGameDDZUtils.cpp
# Opt level: O0

map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_> *
create_poker_number_map(void)

{
  mapped_type *pmVar1;
  map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
  *in_RDI;
  key_type local_58 [16];
  key_type local_18;
  undefined1 local_11;
  map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
  *m;
  
  local_11 = 0;
  std::
  map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
  ::map(in_RDI);
  local_18 = JOKER;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,&local_18);
  *pmVar1 = 0xd;
  local_58[0xc] = 2;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 0xc);
  *pmVar1 = 0xc;
  local_58[0xb] = 1;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 0xb);
  *pmVar1 = 0xb;
  local_58[10] = 0xd;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 10);
  *pmVar1 = 10;
  local_58[9] = 0xc;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 9);
  *pmVar1 = 9;
  local_58[8] = 0xb;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 8);
  *pmVar1 = 8;
  local_58[7] = 10;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 7);
  *pmVar1 = 7;
  local_58[6] = 9;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 6);
  *pmVar1 = 6;
  local_58[5] = 8;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 5);
  *pmVar1 = 5;
  local_58[4] = 7;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 4);
  *pmVar1 = 4;
  local_58[3] = 6;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 3);
  *pmVar1 = 3;
  local_58[2] = 5;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 2);
  *pmVar1 = 2;
  local_58[1] = 4;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58 + 1);
  *pmVar1 = 1;
  local_58[0] = _3;
  pmVar1 = std::
           map<PokerNumber,_int,_std::less<PokerNumber>,_std::allocator<std::pair<const_PokerNumber,_int>_>_>
           ::operator[](in_RDI,local_58);
  *pmVar1 = 0;
  return in_RDI;
}

Assistant:

std::map<PokerNumber,int> create_poker_number_map()
{
        std::map<PokerNumber,int> m;
        m[JOKER]  = 13;
        m[_2]     = 12;
        m[A]      = 11;
        m[K]      = 10;
        m[Q]      = 9;
        m[J]      = 8;
        m[_10]    = 7;
        m[_9]     = 6;
        m[_8]     = 5;
        m[_7]     = 4;
        m[_6]     = 3;
        m[_5]     = 2;
        m[_4]     = 1;
        m[_3]     = 0;
        return m;
}